

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type type,IDLOptions *opts)

{
  char *pcVar1;
  pointer pcVar2;
  long *plVar3;
  size_type *psVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  string local_68;
  string local_48;
  
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&type);
  if (type.base_type - BASE_TYPE_VECTOR < 2) {
LAB_001b5a74:
    if (type.struct_def == (StructDef *)0x0) {
      if (type.element != BASE_TYPE_UNION) goto LAB_001b5b9b;
      NamespacedName_abi_cxx11_(&local_48,this,&(type.enum_def)->super_Definition);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
      goto LAB_001b5b17;
    }
    pcVar1 = (char *)((type.struct_def)->super_Definition).name._M_string_length;
    GenTypeName_ObjectAPI(&local_68,this,(string *)type.struct_def,opts);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - (long)pcVar1
               ,pcVar1,(ulong)local_68._M_dataplus._M_p);
    uVar5 = local_68.field_2._M_allocated_capacity;
    _Var6._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_001b5b9b;
  }
  else {
    if (type.base_type != BASE_TYPE_UNION) {
      if (type.base_type != BASE_TYPE_ARRAY) goto LAB_001b5b9b;
      goto LAB_001b5a74;
    }
    NamespacedName_abi_cxx11_(&local_48,this,&(type.enum_def)->super_Definition);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
LAB_001b5b17:
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    uVar5 = local_48.field_2._M_allocated_capacity;
    _Var6._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_001b5b9b;
  }
  operator_delete(_Var6._M_p,uVar5 + 1);
LAB_001b5b9b:
  if (type.base_type == BASE_TYPE_VECTOR) {
    std::operator+(&local_48,"List<",__return_storage_ptr__);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (type.base_type != BASE_TYPE_ARRAY) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet_ObjectAPI(flatbuffers::Type type,
                                   const IDLOptions &opts) const {
    auto type_name = GenTypeGet(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name =
              GenTypeName_ObjectAPI(type.struct_def->name, opts);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          type_name = NamespacedName(*type.enum_def) + "Union";
        }
        break;
      }

      case BASE_TYPE_UNION: {
        type_name = NamespacedName(*type.enum_def) + "Union";
        break;
      }
      default: break;
    }

    switch (type.base_type) {
      case BASE_TYPE_ARRAY: {
        type_name = type_name + "[]";
        break;
      }
      case BASE_TYPE_VECTOR: {
        type_name = "List<" + type_name + ">";
        break;
      }
      default: break;
    }
    return type_name;
  }